

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Col_meat.hpp
# Opt level: O2

void __thiscall
arma::Col<double>::Col<arma::fill::fill_randn>
          (Col<double> *this,uword in_n_elem,fill_class<arma::fill::fill_randn> *f)

{
  arma_vec_indicator local_11;
  
  Mat<double>::Mat(&this->super_Mat<double>,&local_11,in_n_elem,1,1);
  Mat<double>::randn(&this->super_Mat<double>);
  return;
}

Assistant:

inline
Col<eT>::Col(const uword in_n_elem, const fill::fill_class<fill_type>& f)
  : Mat<eT>(arma_vec_indicator(), in_n_elem, 1, 1)
  {
  arma_debug_sigprint();
  
  (*this).fill(f);
  }